

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyTools.h
# Opt level: O0

void Assimp::NewellNormal<3,3,3,float>(aiVector3t<float> *out,int num,float *x,float *y,float *z)

{
  aiVector3t<float> local_98;
  int local_8c;
  float *pfStack_88;
  int tmp;
  float *zhigh;
  float *zlow;
  float *zptr;
  float *yhigh;
  float *ylow;
  float *yptr;
  float *xhigh;
  float *xlow;
  float *xptr;
  float local_38;
  float sum_zx;
  float sum_yz;
  float sum_xy;
  float *z_local;
  float *y_local;
  float *x_local;
  aiVector3t<float> *paStack_10;
  int num_local;
  aiVector3t<float> *out_local;
  
  x[num * 3] = *x;
  x[(num + 1) * 3] = x[3];
  y[num * 3] = *y;
  y[(num + 1) * 3] = y[3];
  z[num * 3] = *z;
  z[(num + 1) * 3] = z[3];
  sum_zx = 0.0;
  local_38 = 0.0;
  xptr._4_4_ = 0.0;
  xlow = x + 3;
  yptr = x + 6;
  ylow = y + 3;
  zptr = y + 6;
  zlow = z + 3;
  pfStack_88 = z + 6;
  zhigh = z;
  yhigh = y;
  xhigh = x;
  for (local_8c = 0; local_8c < num; local_8c = local_8c + 1) {
    sum_zx = *xlow * (*zptr - *yhigh) + sum_zx;
    local_38 = *ylow * (*pfStack_88 - *zhigh) + local_38;
    xptr._4_4_ = *zlow * (*yptr - *xhigh) + xptr._4_4_;
    xlow = xlow + 3;
    xhigh = xhigh + 3;
    yptr = yptr + 3;
    ylow = ylow + 3;
    yhigh = yhigh + 3;
    zptr = zptr + 3;
    zlow = zlow + 3;
    zhigh = zhigh + 3;
    pfStack_88 = pfStack_88 + 3;
  }
  _sum_yz = z;
  z_local = y;
  y_local = x;
  x_local._4_4_ = num;
  paStack_10 = out;
  aiVector3t<float>::aiVector3t(&local_98,local_38,xptr._4_4_,sum_zx);
  paStack_10->x = local_98.x;
  paStack_10->y = local_98.y;
  paStack_10->z = local_98.z;
  return;
}

Assistant:

inline void NewellNormal (aiVector3t<TReal>& out, int num, TReal* x, TReal* y, TReal* z)
{
    // Duplicate the first two vertices at the end
    x[(num+0)*ofs_x] = x[0];
    x[(num+1)*ofs_x] = x[ofs_x];

    y[(num+0)*ofs_y] = y[0];
    y[(num+1)*ofs_y] = y[ofs_y];

    z[(num+0)*ofs_z] = z[0];
    z[(num+1)*ofs_z] = z[ofs_z];

    TReal sum_xy = 0.0, sum_yz = 0.0, sum_zx = 0.0;

    TReal *xptr = x +ofs_x, *xlow = x, *xhigh = x + ofs_x*2;
    TReal *yptr = y +ofs_y, *ylow = y, *yhigh = y + ofs_y*2;
    TReal *zptr = z +ofs_z, *zlow = z, *zhigh = z + ofs_z*2;

    for (int tmp=0; tmp < num; tmp++) {
        sum_xy += (*xptr) * ( (*yhigh) - (*ylow) );
        sum_yz += (*yptr) * ( (*zhigh) - (*zlow) );
        sum_zx += (*zptr) * ( (*xhigh) - (*xlow) );

        xptr  += ofs_x;
        xlow  += ofs_x;
        xhigh += ofs_x;

        yptr  += ofs_y;
        ylow  += ofs_y;
        yhigh += ofs_y;

        zptr  += ofs_z;
        zlow  += ofs_z;
        zhigh += ofs_z;
    }
    out = aiVector3t<TReal>(sum_yz,sum_zx,sum_xy);
}